

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O3

bool __thiscall DiskInterface::MakeDirs(DiskInterface *this,string *path)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  long lVar4;
  string dir;
  string err;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  lVar4 = std::__cxx11::string::find_last_of((char *)path,0x127097,0xffffffffffffffff);
  if (lVar4 == -1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
  }
  else {
    do {
      if (lVar4 == 0) break;
      lVar1 = lVar4 + -1;
      lVar4 = lVar4 + -1;
    } while ((path->_M_dataplus)._M_p[lVar1] == '/');
    std::__cxx11::string::substr((ulong)&local_60,(ulong)path);
    if (local_60._M_string_length != 0) {
      local_38 = 0;
      local_30 = 0;
      local_40 = &local_30;
      lVar4 = (**(code **)(*(long *)this + 0x18))(this,&local_60,&local_40);
      if (lVar4 < 0) {
        uVar3 = 0;
        Error("%s",local_40);
      }
      else {
        uVar3 = 1;
        if (lVar4 == 0) {
          bVar2 = MakeDirs(this,&local_60);
          if (bVar2) {
            uVar3 = (**(code **)(*(long *)this + 0x20))(this,&local_60);
          }
          else {
            uVar3 = 0;
          }
        }
      }
      if (local_40 != &local_30) {
        operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
      }
      goto LAB_00112243;
    }
  }
  uVar3 = 1;
LAB_00112243:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return (bool)uVar3;
}

Assistant:

bool DiskInterface::MakeDirs(const string& path) {
  string dir = DirName(path);
  if (dir.empty())
    return true;  // Reached root; assume it's there.
  string err;
  TimeStamp mtime = Stat(dir, &err);
  if (mtime < 0) {
    Error("%s", err.c_str());
    return false;
  }
  if (mtime > 0)
    return true;  // Exists already; we're done.

  // Directory doesn't exist.  Try creating its parent first.
  bool success = MakeDirs(dir);
  if (!success)
    return false;
  return MakeDir(dir);
}